

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUITab::CGUITab
          (CGUITab *this,void **vtt,IGUIEnvironment *environment,IGUIElement *parent,
          rect<int> *rectangle,s32 id)

{
  void *pvVar1;
  int iVar2;
  u32 uVar3;
  undefined4 extraout_var;
  rect<int> local_28;
  undefined8 *puVar4;
  
  local_28.UpperLeftCorner = rectangle->UpperLeftCorner;
  local_28.LowerRightCorner = rectangle->LowerRightCorner;
  IGUIElement::IGUIElement((IGUIElement *)this,vtt + 2,EGUIET_TAB,environment,parent,id,&local_28);
  pvVar1 = vtt[1];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[4];
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  (this->BackColor).color = 0;
  this->OverrideTextColorEnabled = false;
  (this->TextColor).color = 0xff000000;
  this->DrawBackground = false;
  iVar2 = (*environment->_vptr_IGUIEnvironment[0xc])(environment);
  puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  if (puVar4 != (undefined8 *)0x0) {
    uVar3 = (**(code **)*puVar4)(puVar4,8);
    (this->TextColor).color = uVar3;
  }
  return;
}

Assistant:

CGUITab::CGUITab(IGUIEnvironment *environment,
		IGUIElement *parent, const core::rect<s32> &rectangle,
		s32 id) :
		IGUITab(environment, parent, id, rectangle),
		BackColor(0, 0, 0, 0), OverrideTextColorEnabled(false), TextColor(255, 0, 0, 0),
		DrawBackground(false)
{
#ifdef _DEBUG
	setDebugName("CGUITab");
#endif

	const IGUISkin *const skin = environment->getSkin();
	if (skin)
		TextColor = skin->getColor(EGDC_BUTTON_TEXT);
}